

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.h
# Opt level: O2

void __thiscall
cmComputeLinkInformation::FeatureDescriptor::~FeatureDescriptor(FeatureDescriptor *this)

{
  std::__cxx11::string::~string((string *)&this->ItemNameFormat);
  std::__cxx11::string::~string((string *)&this->ItemPathFormat);
  std::__cxx11::string::~string((string *)&this->Suffix);
  std::__cxx11::string::~string((string *)&this->Prefix);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

FeatureDescriptor() = default;